

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::TryDecimalStringCast<long,(char)46>
               (char *string_ptr,idx_t string_size,long *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  char *pcVar12;
  undefined7 in_register_00000081;
  uint uVar13;
  int iVar14;
  undefined7 in_register_00000089;
  ulong uVar15;
  bool bVar16;
  ExponentData exponent;
  string_t value;
  DecimalCastData<long> local_e0;
  CastParameters *local_c8;
  long *local_c0;
  ulong local_b8;
  ulong local_b0;
  string local_a8;
  uint local_88;
  undefined4 local_84;
  undefined8 uStack_80;
  ulong local_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar13 = (uint)CONCAT71(in_register_00000089,scale);
  uVar10 = CONCAT71(in_register_00000081,width) & 0xffffffff;
  local_e0.result = 0;
  local_e0.width = (uint8_t)uVar10;
  local_e0.digit_count = '\0';
  local_e0.decimal_count = '\0';
  local_e0.round_set = false;
  local_e0.should_round = false;
  local_e0.excessive_decimals = '\0';
  local_e0.exponent_type = NONE;
  local_e0.limit = *(StoreType_conflict1 *)(NumericHelper::POWERS_OF_TEN + uVar10 * 8);
  local_e0.scale = scale;
  if (string_size != 0) {
    uVar10 = 0;
    do {
      bVar8 = string_ptr[uVar10];
      if ((4 < bVar8 - 9) && (bVar8 != 0x20)) {
        local_e0.digit_count = 0;
        local_c8 = parameters;
        local_c0 = result;
        if (bVar8 == 0x2d) {
          local_e0.result = 0;
          uVar3 = string_size - uVar10;
          uVar4 = 1;
          goto LAB_002b1991;
        }
        if (bVar8 == 0x30 && string_size - 1 != uVar10) {
          bVar1 = string_ptr[uVar10 + 1];
          if (bVar1 < 0x62) {
            if ((bVar1 == 0x42) || (bVar1 == 0x58)) {
LAB_002b1ba3:
              if (0xfffffffffffffffd < (string_size - uVar10) - 3) {
                DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,false>(&local_e0);
                result = local_c0;
              }
              break;
            }
          }
          else if ((bVar1 == 0x62) || (bVar1 == 0x78)) goto LAB_002b1ba3;
        }
        uVar3 = string_size - uVar10;
        local_b8 = (ulong)(bVar8 == 0x2b);
        local_e0.result = 0;
        uVar4 = local_b8;
        goto LAB_002b1c16;
      }
      uVar10 = uVar10 + 1;
    } while (string_size != uVar10);
  }
LAB_002b201d:
  bVar16 = false;
  goto LAB_002b201f;
LAB_002b1991:
  do {
    if (uVar3 <= uVar4) {
      local_e0._11_3_ = 0;
      goto LAB_002b1a87;
    }
    bVar8 = string_ptr[uVar10 + uVar4] - 0x30;
    if (9 < bVar8) {
      local_e0._11_3_ = 0;
      if (string_ptr[uVar10 + uVar4] != '.') goto LAB_002b1e6c;
      uVar5 = uVar4 + 1;
      iVar14 = 3;
      uVar9 = uVar5;
      if (uVar3 <= uVar5) goto LAB_002b1e37;
      local_e0.decimal_count = 0;
      local_e0.round_set = false;
      local_b8 = local_b8 & 0xffffffffffffff00;
      goto LAB_002b1af5;
    }
    uVar5 = uVar4 + 1;
    if ((bVar8 == 0) && (local_e0.result == 0)) {
LAB_002b19be:
      bVar16 = true;
      if ((~uVar4 + string_size != uVar10) && (string_ptr[uVar10 + 1 + uVar4] == '_')) {
        uVar5 = uVar4 + 2;
        if ((string_size - uVar4) - 2 == uVar10) {
          bVar16 = false;
        }
        else {
          bVar16 = (byte)(string_ptr[uVar10 + uVar5] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_e0.digit_count) &&
         (local_e0.digit_count = local_e0.digit_count + 1, -0xccccccccccccccd < local_e0.result)) {
        local_e0.result = local_e0.result * 10 - (ulong)bVar8;
        goto LAB_002b19be;
      }
      bVar16 = false;
    }
    uVar4 = uVar5;
  } while (bVar16);
  goto LAB_002b1cb9;
  while (uVar9 = uVar15, uVar15 < uVar3) {
LAB_002b1af5:
    bVar8 = string_ptr[uVar10 + uVar9] - 0x30;
    local_b0 = uVar5;
    if (9 < bVar8) {
      iVar14 = 0;
      goto LAB_002b1e1b;
    }
    if ((local_e0.decimal_count == scale) && (local_e0.round_set == false)) {
      local_b8 = CONCAT71(local_b8._1_7_,4 < bVar8);
      local_e0.round_set = true;
    }
    if ((uint)local_e0.decimal_count + (uint)local_e0.digit_count < 0x12) {
      local_e0.decimal_count = local_e0.decimal_count + 1;
      local_e0.result = local_e0.result * 10 - (ulong)bVar8;
    }
    uVar15 = uVar9 + 1;
    if (((~uVar9 + string_size != uVar10) && (string_ptr[uVar10 + 1 + uVar9] == '_')) &&
       ((uVar15 = uVar9 + 2, (string_size - uVar9) - 2 == uVar10 ||
        (9 < (byte)(string_ptr[uVar10 + uVar15] - 0x30U))))) {
      local_e0.should_round = (bool)(undefined1)local_b8;
      uVar9 = uVar15;
      iVar6 = 1;
      goto LAB_002b1e4e;
    }
  }
  iVar14 = 3;
LAB_002b1e1b:
  local_e0.should_round = (bool)(undefined1)local_b8;
LAB_002b1e37:
  iVar6 = 1;
  if (uVar5 < uVar9) {
    iVar6 = iVar14;
  }
  if (1 < uVar4) {
    iVar6 = iVar14;
  }
LAB_002b1e4e:
  uVar4 = uVar9;
  if (iVar6 != 3) {
    if (iVar6 != 0) goto LAB_002b201d;
LAB_002b1e6c:
    bVar8 = string_ptr[uVar10 + uVar4];
    bVar16 = false;
    uVar7 = (uint)bVar8;
    if (bVar8 < 0x20) {
      if (4 < uVar7 - 9) goto LAB_002b201f;
    }
    else {
      if ((bVar8 == 0x65) || (uVar7 == 0x45)) {
        if ((uVar4 != 1) && (uVar4 + 1 < uVar3)) {
          local_a8._M_dataplus._M_p._0_2_ = 0;
          pcVar12 = string_ptr + uVar10 + uVar4 + 1;
          iVar11 = ~uVar10 + (string_size - uVar4);
          if (*pcVar12 == '-') {
            bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar11,(IntegerCastData<short> *)&local_a8,false);
          }
          else {
            bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar11,(IntegerCastData<short> *)&local_a8,false);
          }
          bVar16 = false;
          parameters = local_c8;
          result = local_c0;
          if (bVar2 != false) {
            bVar16 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,true>
                               (&local_e0,(int)(short)local_a8._M_dataplus._M_p);
            parameters = local_c8;
            result = local_c0;
          }
          goto LAB_002b201f;
        }
        goto LAB_002b201d;
      }
      if (uVar7 != 0x20) goto LAB_002b201f;
    }
    uVar5 = uVar4 + 1;
    uVar4 = uVar5;
    if (uVar5 < uVar3) {
      do {
        if ((4 < (byte)string_ptr[uVar10 + uVar5] - 9) && (string_ptr[uVar10 + uVar5] != 0x20))
        goto LAB_002b201d;
        uVar5 = uVar5 + 1;
        uVar4 = uVar3;
      } while (uVar3 != uVar5);
    }
  }
LAB_002b1a87:
  bVar16 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,true>(&local_e0);
  if (bVar16) {
    bVar16 = 1 < uVar4;
    parameters = local_c8;
    result = local_c0;
    goto LAB_002b201f;
  }
  goto LAB_002b1ce8;
LAB_002b1c16:
  do {
    if (uVar3 <= uVar4) {
      local_e0._11_3_ = 0;
      goto LAB_002b1cd0;
    }
    bVar8 = string_ptr[uVar10 + uVar4] - 0x30;
    if (9 < bVar8) {
      local_e0._11_3_ = 0;
      if (string_ptr[uVar10 + uVar4] != '.') goto LAB_002b1f77;
      uVar5 = uVar4 + 1;
      iVar14 = 3;
      uVar9 = uVar5;
      if (uVar3 <= uVar5) goto LAB_002b1f41;
      local_e0.decimal_count = 0;
      local_e0.round_set = false;
      local_b0 = local_b0 & 0xffffffffffffff00;
      goto LAB_002b1d4c;
    }
    uVar5 = uVar4 + 1;
    if ((bVar8 == 0) && (local_e0.result == 0)) {
LAB_002b1c43:
      bVar16 = true;
      if ((~uVar4 + string_size != uVar10) && (string_ptr[uVar10 + 1 + uVar4] == '_')) {
        uVar5 = uVar4 + 2;
        if ((string_size - uVar4) - 2 == uVar10) {
          bVar16 = false;
        }
        else {
          bVar16 = (byte)(string_ptr[uVar10 + uVar5] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_e0.digit_count) &&
         (local_e0.digit_count = local_e0.digit_count + 1, local_e0.result < 0xccccccccccccccd)) {
        local_e0.result = (ulong)bVar8 + local_e0.result * 10;
        goto LAB_002b1c43;
      }
      bVar16 = false;
    }
    uVar4 = uVar5;
  } while (bVar16);
LAB_002b1cb9:
  local_e0._11_3_ = 0;
  goto LAB_002b1ce8;
  while (uVar9 = uVar15, uVar15 < uVar3) {
LAB_002b1d4c:
    bVar8 = string_ptr[uVar10 + uVar9] - 0x30;
    local_78 = uVar5;
    if (9 < bVar8) {
      iVar14 = 0;
      goto LAB_002b1f25;
    }
    if ((local_e0.decimal_count == scale) && (local_e0.round_set == false)) {
      local_b0 = CONCAT71(local_b0._1_7_,4 < bVar8);
      local_e0.round_set = true;
    }
    if ((uint)local_e0.decimal_count + (uint)local_e0.digit_count < 0x12) {
      local_e0.decimal_count = local_e0.decimal_count + 1;
      local_e0.result = (ulong)bVar8 + local_e0.result * 10;
    }
    uVar15 = uVar9 + 1;
    if (((~uVar9 + string_size != uVar10) && (string_ptr[uVar10 + 1 + uVar9] == '_')) &&
       ((uVar15 = uVar9 + 2, (string_size - uVar9) - 2 == uVar10 ||
        (9 < (byte)(string_ptr[uVar10 + uVar15] - 0x30U))))) {
      local_e0.should_round = (bool)(undefined1)local_b0;
      uVar9 = uVar15;
      iVar6 = 1;
      goto LAB_002b1f59;
    }
  }
  iVar14 = 3;
LAB_002b1f25:
  local_e0.should_round = (bool)(undefined1)local_b0;
LAB_002b1f41:
  iVar6 = 1;
  if (uVar5 < uVar9) {
    iVar6 = iVar14;
  }
  if (local_b8 < uVar4) {
    iVar6 = iVar14;
  }
LAB_002b1f59:
  uVar4 = uVar9;
  if (iVar6 != 3) {
    if (iVar6 != 0) goto LAB_002b201d;
LAB_002b1f77:
    bVar8 = string_ptr[uVar10 + uVar4];
    bVar16 = false;
    uVar7 = (uint)bVar8;
    if (bVar8 < 0x20) {
      if (4 < uVar7 - 9) goto LAB_002b201f;
    }
    else {
      if ((bVar8 == 0x65) || (uVar7 == 0x45)) {
        if ((uVar4 != local_b8) && (uVar4 + 1 < uVar3)) {
          local_a8._M_dataplus._M_p._0_2_ = 0;
          pcVar12 = string_ptr + uVar10 + uVar4 + 1;
          iVar11 = ~uVar10 + (string_size - uVar4);
          if (*pcVar12 == '-') {
            bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar11,(IntegerCastData<short> *)&local_a8,false);
          }
          else {
            bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar11,(IntegerCastData<short> *)&local_a8,false);
          }
          bVar16 = false;
          parameters = local_c8;
          result = local_c0;
          if (bVar2 != false) {
            bVar16 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,false>
                               (&local_e0,(int)(short)local_a8._M_dataplus._M_p);
            parameters = local_c8;
            result = local_c0;
          }
          goto LAB_002b201f;
        }
        goto LAB_002b201d;
      }
      if (uVar7 != 0x20) goto LAB_002b201f;
    }
    uVar5 = uVar4 + 1;
    uVar4 = uVar5;
    if (uVar5 < uVar3) {
      do {
        if ((4 < (byte)string_ptr[uVar10 + uVar5] - 9) && (string_ptr[uVar10 + uVar5] != 0x20))
        goto LAB_002b201d;
        uVar5 = uVar5 + 1;
        uVar4 = uVar3;
      } while (uVar3 != uVar5);
    }
  }
LAB_002b1cd0:
  bVar16 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,false>(&local_e0);
  if (bVar16) {
    bVar16 = local_b8 < uVar4;
    parameters = local_c8;
    result = local_c0;
    goto LAB_002b201f;
  }
LAB_002b1ce8:
  bVar16 = false;
  parameters = local_c8;
  result = local_c0;
LAB_002b201f:
  if (bVar16 == false) {
    local_88 = (uint)string_size;
    uVar7 = uVar13;
    local_c8 = parameters;
    if (local_88 < 0xd) {
      uStack_80._4_4_ = 0;
      local_84 = 0;
      uStack_80._0_4_ = 0;
      uStack_80 = (char *)0x0;
      if (local_88 != 0) {
        switchD_00b1522a::default(&local_84,string_ptr,(ulong)(local_88 & 0xf));
        uStack_80 = (char *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
      }
    }
    else {
      local_84 = *(undefined4 *)string_ptr;
      uStack_80 = string_ptr;
    }
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Could not convert string \"%s\" to DECIMAL(%d,%d)","");
    pcVar12 = (char *)&local_84;
    if (0xc < (ulong)local_88) {
      pcVar12 = uStack_80;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar12,pcVar12 + local_88);
    StringUtil::Format<std::__cxx11::string,int,int>
              (&local_a8,(StringUtil *)local_50,&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)width,
               uVar13 & 0xff,uVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    HandleCastError::AssignError(&local_a8,local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(local_a8._M_dataplus._M_p._2_6_,(short)local_a8._M_dataplus._M_p) !=
        &local_a8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT62(local_a8._M_dataplus._M_p._2_6_,(short)local_a8._M_dataplus._M_p));
    }
  }
  else {
    *result = local_e0.result;
  }
  return bVar16;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}